

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O3

char * VL53L1X::rangeStatusToString(RangeStatus status)

{
  switch(status) {
  case RangeValid:
    return "range valid";
  case SigmaFail:
    return "sigma fail";
  case SignalFail:
    return "signal fail";
  case RangeValidMinRangeClipped:
    return "range valid, min range clipped";
  case OutOfBoundsFail:
    return "out of bounds fail";
  case HardwareFail:
    return "hardware fail";
  case RangeValidNoWrapCheckFail:
    return "range valid, no wrap check fail";
  case WrapTargetFail:
    return "wrap target fail";
  case 8:
  case SynchronizationInt|SigmaFail:
  case 0xc:
    goto switchD_00109619_caseD_8;
  case XtalkSignalFail:
    return "xtalk signal fail";
  case SynchronizationInt:
    return "synchronization int";
  case MinRangeFail:
    return "min range fail";
  default:
    if (status == RangeInvalid) {
      return "no update";
    }
switchD_00109619_caseD_8:
    return "unknown status";
  }
}

Assistant:

const char * VL53L1X::rangeStatusToString(VL53L1X_DEFINITIONS::RangeStatus status)
{
  switch (status)
  {
    case VL53L1X_DEFINITIONS::RangeValid:
      return "range valid";

    case VL53L1X_DEFINITIONS::SigmaFail:
      return "sigma fail";

    case VL53L1X_DEFINITIONS::SignalFail:
      return "signal fail";

    case VL53L1X_DEFINITIONS::RangeValidMinRangeClipped:
      return "range valid, min range clipped";

    case VL53L1X_DEFINITIONS::OutOfBoundsFail:
      return "out of bounds fail";

    case VL53L1X_DEFINITIONS::HardwareFail:
      return "hardware fail";

    case VL53L1X_DEFINITIONS::RangeValidNoWrapCheckFail:
      return "range valid, no wrap check fail";

    case VL53L1X_DEFINITIONS::WrapTargetFail:
      return "wrap target fail";

    case VL53L1X_DEFINITIONS::XtalkSignalFail:
      return "xtalk signal fail";

    case VL53L1X_DEFINITIONS::SynchronizationInt:
      return "synchronization int";

    case VL53L1X_DEFINITIONS::MinRangeFail:
      return "min range fail";

    case VL53L1X_DEFINITIONS::RangeInvalid:
      return "no update";

    default:
      return "unknown status";
  }
}